

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O2

bool rapidjson::internal::StrtodFast(double d,int p,double *result)

{
  bool bVar1;
  double dVar2;
  
  if (p - 0x17U < 0xf) {
    dVar2 = Pow10(p + -0x16);
    d = d * dVar2;
    p = 0x16;
  }
  bVar1 = p + 0x16U < 0x2d;
  if (d <= 9007199254740991.0 && bVar1) {
    dVar2 = FastPath(d,p);
    *result = dVar2;
  }
  return d <= 9007199254740991.0 && bVar1;
}

Assistant:

inline bool StrtodFast(double d, int p, double* result) {
    // Use fast path for string-to-double conversion if possible
    // see http://www.exploringbinary.com/fast-path-decimal-to-floating-point-conversion/
    if (p > 22  && p < 22 + 16) {
        // Fast Path Cases In Disguise
        d *= internal::Pow10(p - 22);
        p = 22;
    }

    if (p >= -22 && p <= 22 && d <= 9007199254740991.0) { // 2^53 - 1
        *result = FastPath(d, p);
        return true;
    }
    else
        return false;
}